

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcVertexLoop::IfcVertexLoop(IfcVertexLoop *this)

{
  IfcVertexLoop *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x48,"IfcVertexLoop");
  IfcLoop::IfcLoop(&this->super_IfcLoop,&PTR_construction_vtable_24__00fe1948);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcVertexLoop,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcVertexLoop,_1UL> *)
             &(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.field_0x30,
             &PTR_construction_vtable_24__00fe19c0);
  (this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfe1890;
  *(undefined8 *)&this->field_0x48 = 0xfe1930;
  *(undefined8 *)
   &(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfe18b8;
  *(undefined8 *)
   &(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfe18e0;
  *(undefined8 *)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.field_0x30 = 0xfe1908
  ;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcVertex>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcVertex> *)&(this->super_IfcLoop).field_0x40,
             (LazyObject *)0x0);
  return;
}

Assistant:

IfcVertexLoop() : Object("IfcVertexLoop") {}